

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coba.cpp
# Opt level: O0

void fun1(int px,int py)

{
  int iVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int y;
  int x;
  int i;
  int py_local;
  int px_local;
  
  y = 0;
  for (local_1c = 100; local_1c < 1000; local_1c = local_1c + 1) {
    iVar1 = y + 1;
    for (local_18 = 100; local_18 < 1000; local_18 = local_18 + 1) {
      if (((0x9f < local_18) && (local_18 < 0xab)) && (local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((99 < local_1c) && (local_1c < 0x6f)) && ((0x9f < local_18 && (local_18 < 0xc9)))) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x77 < local_1c) && (local_1c < 0x83)) && ((0x9f < local_18 && (local_18 < 0xc9)))) {
        setWarna(px + local_18,py + local_1c);
      }
      if ((0xbd < local_18) && (local_18 < 0xc9 && local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((99 < local_1c) && (local_1c < 0x6f)) && (local_18 < 0x97)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x95 < local_1c) && (local_1c < 0xa1)) && (local_18 < 0x97)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x96 - iVar1 <= local_18) && (local_18 <= 0xa0 - iVar1)) &&
         ((iVar1 < 0x32 && (0x6d < local_1c)))) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0xd1 < local_18) && (local_18 < 0xdd)) && (local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((y + 0xd3 <= local_18) && (local_18 <= y + 0xdd)) && (iVar1 < 0x32)) {
        setWarna(px + local_18,py + local_1c);
      }
      if ((0x103 < local_18) && (local_18 < 0x10f && local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x117 < local_18) && (local_18 < 0x123)) && (local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((y + 0x119 <= local_18) && (local_18 <= y + 0x123)) && (iVar1 < 0x1e)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x136 - (y + -0x1d) <= local_18) && (local_18 <= 0x140 - (y + -0x1d))) &&
         ((iVar1 < 0x3c && (0x81 < local_1c)))) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x117 < local_18) && (local_18 < 0x123)) && (local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((y + 0x119 <= local_18) && (local_18 <= y + 0x123)) && (iVar1 < 0x1e)) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x136 - (y + -0x1d) <= local_18) && (local_18 <= 0x140 - (y + -0x1d))) &&
         ((iVar1 < 0x3c && (0x81 < local_1c)))) {
        setWarna(px + local_18,py + local_1c);
      }
      if (((0x149 < local_18) && (local_18 < 0x155)) && (local_1c < 0xa1)) {
        setWarna(px + local_18,py + local_1c);
      }
    }
    y = iVar1;
  }
  return;
}

Assistant:

void fun1(int px, int py) {
	int i = 0, x, y;
  // Figure out where in memory to put the pixel
  for (y = 100; y < 1000; y++) {
	  i++;
    for (x = 100; x < 1000; x++) {
      if(x>=160&&x<=170&&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(y>=120&&y<=130&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(x>=190&&x<=200&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x<=150){
					setWarna(px+x,py+y);
				}
			if(y>=150&&y<=160&&x<=150){
					setWarna(px+x,py+y);
				}
			if(x>=150-i&&x<=160-i&&i<50&&y>=110){
				  setWarna(px+x,py+y);
			}
			if(x>=210&&x<=220&&y<=160){
                setWarna(px+x,py+y);
				}
				
				if(x>=210+i&&x<=220+i&&i<50){
                setWarna(px+x,py+y);
				}

				if(x>=260&&x<=270&y<=160){
                setWarna(px+x,py+y);
				}	
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=330&&x<=340&&y<=160){
                setWarna(px+x,py+y);
				}
    }
  }
}